

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

shared_ptr<pstack::Dwarf::Info> __thiscall pstack::Context::getDwarf(Context *this,string *filename)

{
  bool in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  sptr sVar2;
  shared_ptr<pstack::Dwarf::Info> sVar3;
  undefined1 local_30 [16];
  
  getImageForName((Context *)local_30,filename,in_DL);
  sVar2 = getDwarf(this,(sptr *)filename);
  _Var1 = sVar2.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_);
    _Var1._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar3.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Dwarf::Info>)
         sVar3.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Dwarf::Info>
Context::getDwarf(const std::string &filename)
{
    return getDwarf(getImageForName(filename));
}